

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.c
# Opt level: O2

translation_module_t * modules_init(void)

{
  translation_module_t *modules;
  
  modules = (translation_module_t *)malloc(0x40);
  modules->tagOpen = (char *)0x0;
  modules->tagClose = (char *)0x0;
  modules->next = (s_translation_module *)0x0;
  cchoose_register(modules);
  cforeach_register(modules);
  cif_register(modules);
  cout_register(modules);
  cremove_register(modules);
  cset_register(modules);
  expression_register(modules);
  return modules;
}

Assistant:

translation_module_t *modules_init() {
	translation_module_t *modules = (translation_module_t *) malloc(sizeof(translation_module_t));
	modules->tagOpen = NULL;
	modules->tagClose = NULL;
	modules->next = NULL;

	cchoose_register(modules);
	cforeach_register(modules);
	cif_register(modules);
	cout_register(modules);
	cremove_register(modules);
	cset_register(modules);
	expression_register(modules);

	return modules;
}